

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

bool __thiscall cmSystemTools::EnvDiff::ParseOperation(EnvDiff *this,string *envmod)

{
  _Alloc_hider __s1;
  int iVar1;
  long lVar2;
  iterator __position;
  optional<std::__cxx11::string> *this_00;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  bool bVar3;
  size_type __rlen;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  anon_class_8_1_8991fb9c apply_diff;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> op;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  char local_111;
  anon_class_8_1_8991fb9c local_110;
  undefined1 local_108 [16];
  code *local_f8;
  code *pcStack_f0;
  ulong local_e8;
  char *local_e0;
  string local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  cmAlphaNum local_50;
  
  local_110.this = this;
  lVar2 = std::__cxx11::string::find((char)envmod,0x3d);
  if (lVar2 == -1) {
    pcStack_f0 = (code *)(envmod->_M_dataplus)._M_p;
    local_f8 = (code *)envmod->_M_string_length;
    local_108._0_8_ = (pointer)0x2f;
    local_108._8_8_ = "Error: Missing `=` after the variable name in: ";
    local_e0 = local_50.Digits_;
    local_50.View_._M_len = 1;
    local_50.Digits_[0] = '\n';
    local_e8._0_1_ = '\x01';
    local_e8._1_1_ = '\0';
    local_e8._2_1_ = '\0';
    local_e8._3_1_ = '\0';
    local_e8._4_1_ = '\0';
    local_e8._5_1_ = '\0';
    local_e8._6_1_ = '\0';
    local_e8._7_1_ = '\0';
    views._M_len = 3;
    views._M_array = (iterator)local_108;
    local_50.View_._M_str = local_e0;
    cmCatViews_abi_cxx11_(&local_d0,views);
    Error(&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    return false;
  }
  std::__cxx11::string::substr((ulong)&local_d0,(ulong)envmod);
  lVar2 = std::__cxx11::string::find((char)envmod,0x3a);
  if (lVar2 == -1) {
    pcStack_f0 = (code *)(envmod->_M_dataplus)._M_p;
    local_f8 = (code *)envmod->_M_string_length;
    local_108._0_8_ = (pointer)0x2b;
    local_108._8_8_ = "Error: Missing `:` after the operation in: ";
    local_e0 = local_50.Digits_;
    local_50.View_._M_len = 1;
    local_50.Digits_[0] = '\n';
    local_e8 = 1;
    views_00._M_len = 3;
    views_00._M_array = (iterator)local_108;
    local_50.View_._M_str = local_e0;
    cmCatViews_abi_cxx11_(&local_b0,views_00);
    Error(&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    bVar3 = false;
    goto LAB_001f267b;
  }
  std::__cxx11::string::substr((ulong)&local_b0,(ulong)envmod);
  std::__cxx11::string::substr((ulong)&local_70,(ulong)envmod);
  __s1._M_p = local_b0._M_dataplus._M_p;
  if ((local_b0._M_string_length == 5) &&
     (iVar1 = bcmp(local_b0._M_dataplus._M_p,"reset",5), iVar1 == 0)) {
    __position = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)this,&local_d0);
    bVar3 = true;
    if ((_Rb_tree_header *)__position._M_node != &(this->diff)._M_t._M_impl.super__Rb_tree_header) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::_M_erase_aux((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)this,(const_iterator)__position._M_node);
    }
  }
  else if ((local_b0._M_string_length == 3) && (iVar1 = bcmp(__s1._M_p,"set",3), iVar1 == 0)) {
    this_00 = (optional<std::__cxx11::string> *)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::operator[](&this->diff,&local_d0);
    bVar3 = true;
    std::optional<std::__cxx11::string>::operator=(this_00,&local_70);
  }
  else {
    if ((local_b0._M_string_length == 5) && (iVar1 = bcmp(__s1._M_p,"unset",5), iVar1 == 0)) {
      local_e8 = local_e8 & 0xffffffffffffff00;
      this_01 = (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[](&this->diff,&local_d0);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_move_assign(this_01,(_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_108);
      if (((bool)(undefined1)local_e8 == true) &&
         (local_e8 = local_e8 & 0xffffffffffffff00, (code **)local_108._0_8_ != &local_f8)) {
        operator_delete((void *)local_108._0_8_,(ulong)((long)local_f8 + 1));
      }
    }
    else {
      local_108._0_8_ = &local_70;
      if (local_b0._M_string_length == 0x10) {
        iVar1 = bcmp(__s1._M_p,"path_list_append",0x10);
        if (iVar1 != 0) goto LAB_001f21b3;
        local_108._8_8_ = (char *)0x3a;
        pcStack_f0 = std::
                     _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmSystemTools.cxx:1749:22)>
                     ::_M_invoke;
        local_f8 = std::
                   _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmSystemTools.cxx:1749:22)>
                   ::_M_manager;
        ParseOperation::anon_class_8_1_8991fb9c::operator()
                  (&local_110,&local_d0,
                   (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)local_108);
        if (local_f8 != (code *)0x0) {
          (*local_f8)(local_108,local_108,3);
        }
      }
      else if (local_b0._M_string_length == 0xe) {
        iVar1 = bcmp(__s1._M_p,"string_prepend",0xe);
        if (iVar1 != 0) goto LAB_001f21b3;
        local_108._8_8_ = (char *)0x0;
        pcStack_f0 = std::
                     _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmSystemTools.cxx:1747:16)>
                     ::_M_invoke;
        local_f8 = std::
                   _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmSystemTools.cxx:1747:16)>
                   ::_M_manager;
        ParseOperation::anon_class_8_1_8991fb9c::operator()
                  (&local_110,&local_d0,
                   (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)local_108);
        if (local_f8 != (code *)0x0) {
          (*local_f8)(local_108,local_108,3);
        }
      }
      else if ((local_b0._M_string_length == 0xd) &&
              (iVar1 = bcmp(__s1._M_p,"string_append",0xd), iVar1 == 0)) {
        local_108._8_8_ = (char *)0x0;
        pcStack_f0 = std::
                     _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmSystemTools.cxx:1744:22)>
                     ::_M_invoke;
        local_f8 = std::
                   _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmSystemTools.cxx:1744:22)>
                   ::_M_manager;
        ParseOperation::anon_class_8_1_8991fb9c::operator()
                  (&local_110,&local_d0,
                   (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)local_108);
        if (local_f8 != (code *)0x0) {
          (*local_f8)(local_108,local_108,3);
        }
      }
      else {
LAB_001f21b3:
        if (local_b0._M_string_length == 0x11) {
          iVar1 = bcmp(__s1._M_p,"path_list_prepend",0x11);
          if (iVar1 == 0) {
            local_108._8_8_ = (char *)0x3a;
            pcStack_f0 = std::
                         _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmSystemTools.cxx:1756:22)>
                         ::_M_invoke;
            local_f8 = std::
                       _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmSystemTools.cxx:1756:22)>
                       ::_M_manager;
            ParseOperation::anon_class_8_1_8991fb9c::operator()
                      (&local_110,&local_d0,
                       (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)local_108);
            if (local_f8 != (code *)0x0) {
              (*local_f8)(local_108,local_108,3);
            }
          }
          else {
            iVar1 = bcmp(__s1._M_p,"cmake_list_append",0x11);
            if (iVar1 != 0) goto LAB_001f21f3;
            local_108._8_8_ = (char *)0x0;
            pcStack_f0 = std::
                         _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmSystemTools.cxx:1763:22)>
                         ::_M_invoke;
            local_f8 = std::
                       _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmSystemTools.cxx:1763:22)>
                       ::_M_manager;
            ParseOperation::anon_class_8_1_8991fb9c::operator()
                      (&local_110,&local_d0,
                       (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)local_108);
            if (local_f8 != (code *)0x0) {
              (*local_f8)(local_108,local_108,3);
            }
          }
        }
        else {
LAB_001f21f3:
          if ((local_b0._M_string_length != 0x12) ||
             (iVar1 = bcmp(__s1._M_p,"cmake_list_prepend",0x12), iVar1 != 0)) {
            local_108._0_8_ = (pointer)0x37;
            local_108._8_8_ = "Error: Unrecognized environment manipulation argument: ";
            local_50.View_._M_len = local_b0._M_string_length;
            local_50.View_._M_str = __s1._M_p;
            local_111 = '\n';
            cmStrCat<char>(&local_90,(cmAlphaNum *)local_108,&local_50,&local_111);
            Error(&local_90);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
            }
            bVar3 = false;
            goto LAB_001f263f;
          }
          local_108._8_8_ = (char *)0x0;
          pcStack_f0 = std::
                       _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmSystemTools.cxx:1770:22)>
                       ::_M_invoke;
          local_f8 = std::
                     _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmSystemTools.cxx:1770:22)>
                     ::_M_manager;
          ParseOperation::anon_class_8_1_8991fb9c::operator()
                    (&local_110,&local_d0,
                     (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)local_108);
          if (local_f8 != (code *)0x0) {
            (*local_f8)(local_108,local_108,3);
          }
        }
      }
    }
    bVar3 = true;
  }
LAB_001f263f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
LAB_001f267b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool cmSystemTools::EnvDiff::ParseOperation(const std::string& envmod)
{
  char path_sep = GetSystemPathlistSeparator();

  auto apply_diff = [this](const std::string& name,
                           std::function<void(std::string&)> const& apply) {
    cm::optional<std::string> old_value = diff[name];
    std::string output;
    if (old_value) {
      output = *old_value;
    } else {
      const char* curval = cmSystemTools::GetEnv(name);
      if (curval) {
        output = curval;
      }
    }
    apply(output);
    diff[name] = output;
  };

  // Split on `=`
  auto const eq_loc = envmod.find_first_of('=');
  if (eq_loc == std::string::npos) {
    cmSystemTools::Error(cmStrCat(
      "Error: Missing `=` after the variable name in: ", envmod, '\n'));
    return false;
  }

  auto const name = envmod.substr(0, eq_loc);

  // Split value on `:`
  auto const op_value_start = eq_loc + 1;
  auto const colon_loc = envmod.find_first_of(':', op_value_start);
  if (colon_loc == std::string::npos) {
    cmSystemTools::Error(
      cmStrCat("Error: Missing `:` after the operation in: ", envmod, '\n'));
    return false;
  }
  auto const op = envmod.substr(op_value_start, colon_loc - op_value_start);

  auto const value_start = colon_loc + 1;
  auto const value = envmod.substr(value_start);

  // Determine what to do with the operation.
  if (op == "reset"_s) {
    auto entry = diff.find(name);
    if (entry != diff.end()) {
      diff.erase(entry);
    }
  } else if (op == "set"_s) {
    diff[name] = value;
  } else if (op == "unset"_s) {
    diff[name] = {};
  } else if (op == "string_append"_s) {
    apply_diff(name, [&value](std::string& output) { output += value; });
  } else if (op == "string_prepend"_s) {
    apply_diff(name,
               [&value](std::string& output) { output.insert(0, value); });
  } else if (op == "path_list_append"_s) {
    apply_diff(name, [&value, path_sep](std::string& output) {
      if (!output.empty()) {
        output += path_sep;
      }
      output += value;
    });
  } else if (op == "path_list_prepend"_s) {
    apply_diff(name, [&value, path_sep](std::string& output) {
      if (!output.empty()) {
        output.insert(output.begin(), path_sep);
      }
      output.insert(0, value);
    });
  } else if (op == "cmake_list_append"_s) {
    apply_diff(name, [&value](std::string& output) {
      if (!output.empty()) {
        output += ';';
      }
      output += value;
    });
  } else if (op == "cmake_list_prepend"_s) {
    apply_diff(name, [&value](std::string& output) {
      if (!output.empty()) {
        output.insert(output.begin(), ';');
      }
      output.insert(0, value);
    });
  } else {
    cmSystemTools::Error(cmStrCat(
      "Error: Unrecognized environment manipulation argument: ", op, '\n'));
    return false;
  }

  return true;
}